

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::UnboundedLiteral::evalImpl
          (ConstantValue *__return_storage_ptr__,UnboundedLiteral *this,EvalContext *context)

{
  Variant *pVVar1;
  bool bVar2;
  Queue *this_00;
  SVQueue *this_01;
  size_type sVar3;
  SVInt local_40;
  int local_30;
  bitmask<slang::ast::EvalFlags> local_29;
  int32_t size;
  ConstantValue *target;
  EvalContext *context_local;
  UnboundedLiteral *this_local;
  
  target = (ConstantValue *)context;
  context_local = (EvalContext *)this;
  this_local = (UnboundedLiteral *)__return_storage_ptr__;
  _size = EvalContext::getQueueTarget(context);
  if (_size == (ConstantValue *)0x0) {
    pVVar1 = &target->value;
    bitmask<slang::ast::EvalFlags>::bitmask(&local_29,AllowUnboundedPlaceholder);
    bVar2 = bitmask<slang::ast::EvalFlags>::has
                      ((bitmask<slang::ast::EvalFlags> *)
                       ((long)&(pVVar1->
                               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               ).
                               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       + 8),&local_29);
    if (bVar2) {
      slang::ConstantValue::ConstantValue(__return_storage_ptr__);
    }
    else {
      slang::ConstantValue::ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
    }
  }
  else {
    this_00 = slang::ConstantValue::queue(_size);
    this_01 = CopyPtr<slang::SVQueue>::operator->(this_00);
    sVar3 = std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                      (&this_01->
                        super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>);
    local_30 = (int)sVar3;
    SVInt::SVInt(&local_40,0x20,(long)(local_30 + -1),true);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_40);
    SVInt::~SVInt(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue UnboundedLiteral::evalImpl(EvalContext& context) const {
    // If we're evaluating in a context with a queue target expression, use the
    // max bound of that queue. Otherwise assume we're assigning to a constant (parameter)
    // and use a placeholder value to indicate that.
    auto target = context.getQueueTarget();
    if (!target) {
        if (context.flags.has(EvalFlags::AllowUnboundedPlaceholder))
            return ConstantValue::UnboundedPlaceholder{};
        return nullptr;
    }

    int32_t size = (int32_t)target->queue()->size();
    return SVInt(32, uint64_t(size - 1), true);
}